

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O2

void __thiscall JsrtDebugStackFrames::ClearFrameDictionary(JsrtDebugStackFrames *this)

{
  int iVar1;
  FramesDictionary *pFVar2;
  JsrtDebuggerStackFrame *obj;
  ArenaAllocator *allocator;
  ulong uVar3;
  int iVar4;
  
  pFVar2 = this->framesDictionary;
  if (pFVar2 == (FramesDictionary *)0x0) {
    return;
  }
  for (uVar3 = 0; uVar3 < pFVar2->bucketCount; uVar3 = uVar3 + 1) {
    iVar4 = pFVar2->buckets[uVar3];
    if (pFVar2->buckets[uVar3] != -1) {
      while (iVar4 != -1) {
        iVar1 = pFVar2->entries[iVar4].
                super_DefaultHashedEntry<unsigned_int,_JsrtDebuggerStackFrame_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<unsigned_int,_JsrtDebuggerStackFrame_*>.
                super_ValueEntry<JsrtDebuggerStackFrame_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_JsrtDebuggerStackFrame_*>_>
                .super_KeyValueEntryDataLayout2<unsigned_int,_JsrtDebuggerStackFrame_*>.next;
        obj = pFVar2->entries[iVar4].
              super_DefaultHashedEntry<unsigned_int,_JsrtDebuggerStackFrame_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
              .super_KeyValueEntry<unsigned_int,_JsrtDebuggerStackFrame_*>.
              super_ValueEntry<JsrtDebuggerStackFrame_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_JsrtDebuggerStackFrame_*>_>
              .super_KeyValueEntryDataLayout2<unsigned_int,_JsrtDebuggerStackFrame_*>.value;
        allocator = JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager);
        Memory::
        DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,JsrtDebuggerStackFrame>
                  (allocator,obj);
        iVar4 = iVar1;
      }
    }
  }
  JsUtil::
  BaseDictionary<unsigned_int,_JsrtDebuggerStackFrame_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Clear(this->framesDictionary);
  return;
}

Assistant:

void JsrtDebugStackFrames::ClearFrameDictionary()
{
    if (this->framesDictionary != nullptr)
    {
        this->framesDictionary->Map([this](uint handle, JsrtDebuggerStackFrame* debuggerStackFrame) {
            Adelete(this->jsrtDebugManager->GetDebugObjectArena(), debuggerStackFrame);
        });
        this->framesDictionary->Clear();
    }
}